

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

ExprBase * AnalyzeTypeSimple(ExpressionContext *ctx,SynTypeSimple *syntax)

{
  TypeBase *pTVar1;
  int iVar2;
  TypeBase *pTVar3;
  undefined4 extraout_var;
  ExprBase *pEVar4;
  
  pTVar3 = AnalyzeType(ctx,&syntax->super_SynBase,false,(bool *)0x0);
  if (pTVar3 == (TypeBase *)0x0) {
    pEVar4 = AnalyzeVariableAccess(ctx,syntax);
    return pEVar4;
  }
  if (pTVar3 != ctx->typeAuto) {
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
    pEVar4 = (ExprBase *)CONCAT44(extraout_var,iVar2);
    pTVar1 = ctx->typeTypeID;
    pEVar4->typeID = 8;
    pEVar4->source = &syntax->super_SynBase;
    pEVar4->type = pTVar1;
    pEVar4->next = (ExprBase *)0x0;
    pEVar4->listed = false;
    pEVar4->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e6550;
    pEVar4[1]._vptr_ExprBase = (_func_int **)pTVar3;
    return pEVar4;
  }
  anon_unknown.dwarf_1117a3::Stop
            (ctx,&syntax->super_SynBase,"ERROR: cannot take typeid from auto type");
}

Assistant:

ExprBase* AnalyzeTypeSimple(ExpressionContext &ctx, SynTypeSimple *syntax)
{
	// It could be a typeid
	if(TypeBase *type = AnalyzeType(ctx, syntax, false))
	{
		if(type == ctx.typeAuto)
			Stop(ctx, syntax, "ERROR: cannot take typeid from auto type");

		return new (ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(syntax, ctx.typeTypeID, type);
	}

	return AnalyzeVariableAccess(ctx, syntax);
}